

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O1

void __thiscall
TPZStructMatrixOT<double>::Serial_Assemble
          (TPZStructMatrixOT<double> *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *mesh;
  TPZCompEl *pTVar1;
  TPZReference *pTVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  TPZCompEl **ppTVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  TPZFMatrix<double> *rhs;
  long lVar13;
  bool bVar14;
  TPZTimer assemble;
  TPZTimer calcstiff;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  char local_87d1;
  TPZStructMatrixOT<double> *local_87d0;
  long local_87c8;
  TPZEquationFilter *local_87c0;
  long *local_87b8;
  int64_t local_87b0;
  long local_87a8;
  TPZFMatrix<double> *local_87a0;
  TPZFNMatrix<1000,_double> *local_8798;
  TPZFMatrix<double> *local_8790;
  TPZFMatrix<double> *local_8788;
  TPZFNMatrix<1000,_double> *local_8780;
  TPZAutoPointer<TPZGuiInterface> *local_8778;
  long *local_8770;
  long local_8768;
  long local_8760 [2];
  long *local_8750;
  long local_8748;
  long local_8740 [2];
  undefined1 local_8730 [32];
  _Alloc_hider local_8710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8700;
  undefined1 local_86f0 [32];
  _Alloc_hider local_86d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_86c0;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  local_87d0 = this;
  local_8778 = guiInterface;
  lVar6 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((lVar6 == 0) ||
     (lVar6 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0),
     lVar6 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZStructMatrixOT<double>::Serial_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = double]"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": incompatible types. Aborting...\n",0x22);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xd0);
  }
  lVar6 = __dynamic_cast(local_87d0,&typeinfo,&TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  mesh = *(TPZCompMesh **)(lVar6 + 8);
  local_87b8 = (long *)__dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                                      &TPZMatrix<double>::typeinfo,0);
  if ((local_87b8 == (long *)0x0) ||
     (local_8790 = (TPZFMatrix<double> *)
                   __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0)
     , local_8790 == (TPZFMatrix<double> *)0x0)) {
    __cxa_bad_cast();
  }
  if (mesh == (TPZCompMesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Serial_Assemble called without mesh",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xdb);
  }
  local_87b0 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370,mesh,EF);
  local_8750 = local_8740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8750,"Computing the stiffness matrices","");
  local_86f0._24_8_ = 0.0;
  local_86d0._M_p = (pointer)&local_86c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_86d0,local_8750,local_8748 + (long)local_8750);
  if (local_8750 != local_8740) {
    operator_delete(local_8750,local_8740[0] + 1);
  }
  local_8770 = local_8760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8770,"Assembling the stiffness matrices","");
  local_8730._24_8_ = 0.0;
  local_8710._M_p = (pointer)&local_8700;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8710,local_8770,local_8768 + (long)local_8770);
  local_87c8 = lVar6;
  if (local_8770 != local_8760) {
    operator_delete(local_8770,local_8760[0] + 1);
  }
  if (0 < local_87b0) {
    local_87c0 = (TPZEquationFilter *)(local_87c8 + 0x48);
    local_87a8 = local_87c8 + 0x18;
    lVar13 = local_87c8 + 0x20;
    local_8780 = &local_86b0.fConstrMat;
    local_8788 = &local_4370.fConstrMat.super_TPZFMatrix<double>;
    local_8798 = &local_86b0.fMat;
    local_87a0 = &local_4370.fMat.super_TPZFMatrix<double>;
    lVar6 = 0;
    lVar12 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar6);
      pTVar1 = *ppTVar7;
      if (pTVar1 == (TPZCompEl *)0x0) {
        bVar14 = false;
      }
      else {
        if (*(int *)(local_87c8 + 0x40) != 0) {
          plVar8 = (long *)(**(code **)(*(long *)pTVar1 + 0xb8))(pTVar1);
          plVar9 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                          0x918);
          if (plVar8 == (long *)0x0) {
            bVar4 = true;
            if ((plVar9 != (long *)0x0) &&
               (cVar3 = (**(code **)(*plVar9 + 0x140))(plVar9,local_87a8), cVar3 != '\0'))
            goto LAB_01363855;
          }
          else {
            iVar5 = (**(code **)(*plVar8 + 0x58))(plVar8);
            if (*(int *)(local_87c8 + 0x40) == 0) {
              bVar14 = true;
            }
            else {
              lVar10 = lVar13;
              for (lVar11 = *(long *)(local_87c8 + 0x28); lVar11 != 0;
                  lVar11 = *(long *)(lVar11 + 0x10 + (ulong)(*(int *)(lVar11 + 0x20) < iVar5) * 8))
              {
                if (iVar5 <= *(int *)(lVar11 + 0x20)) {
                  lVar10 = lVar11;
                }
              }
              lVar11 = lVar13;
              if ((lVar10 != lVar13) && (lVar11 = lVar10, iVar5 < *(int *)(lVar10 + 0x20))) {
                lVar11 = lVar13;
              }
              bVar14 = lVar11 != lVar13;
            }
            if (bVar14) {
LAB_01363855:
              bVar4 = false;
            }
            else {
              bVar4 = true;
            }
          }
          bVar14 = false;
          if (bVar4) goto LAB_01363a97;
        }
        lVar12 = lVar12 + 1;
        if ((lVar12 * 0x1cac083126e978d5 + 0x10624dd2f1a9fb8U >> 3 |
            lVar12 * 0x1cac083126e978d5 << 0x3d) < 0x4189374bc6a7ef) {
          local_87d1 = '*';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_87d1,1);
          std::ostream::flush();
        }
        if ((lVar12 * -0x2d77318fc504816f + 0x346dc5d6388640U >> 5 |
            lVar12 * -0x2d77318fc504816f << 0x3b) < 0x346dc5d638865) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        TPZTimer::start((TPZTimer *)local_86f0);
        (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,&local_86b0,&local_4370);
        pTVar2 = local_8778->fRef;
        if ((pTVar2 != (TPZReference *)0x0) && (pTVar2->fPointer != (TPZGuiInterface *)0x0)) {
          bVar4 = TPZGuiInterface::AmIKilled(pTVar2->fPointer);
          bVar14 = true;
          if (bVar4) goto LAB_01363a97;
        }
        TPZTimer::stop((TPZTimer *)local_86f0);
        TPZTimer::start((TPZTimer *)local_8730);
        iVar5 = (**(code **)(*(long *)pTVar1 + 0x1f0))(pTVar1);
        if (iVar5 == 0) {
          TPZElementMatrix::ComputeDestinationIndices(&local_86b0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (local_87c0,&local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          (**(code **)(*local_87b8 + 0x1a0))
                    (local_87b8,local_8798,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex);
          rhs = local_87a0;
          if (*(char *)((long)&(local_87d0->fElBlocked)._vptr_TPZVec +
                       *(long *)(*(long *)local_87d0 + -0x60) + 4) != '\0') goto LAB_01363a6d;
        }
        else {
          TPZElementMatrixT<double>::ApplyConstraints(&local_86b0);
          TPZElementMatrixT<double>::ApplyConstraints(&local_4370);
          TPZElementMatrix::ComputeDestinationIndices(&local_86b0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (local_87c0,&local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          (**(code **)(*local_87b8 + 0x1a0))
                    (local_87b8,local_8780,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex);
          rhs = local_8788;
          if (*(char *)((long)&(local_87d0->fElBlocked)._vptr_TPZVec +
                       *(long *)(*(long *)local_87d0 + -0x60) + 4) == '\x01') {
LAB_01363a6d:
            TPZFMatrix<double>::AddFel
                      (local_8790,rhs,
                       &local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                       &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          }
        }
        bVar14 = false;
        TPZTimer::stop((TPZTimer *)local_8730);
      }
LAB_01363a97:
    } while ((!bVar14) && (lVar6 = lVar6 + 1, lVar6 != local_87b0));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8710._M_p != &local_8700) {
    operator_delete(local_8710._M_p,local_8700._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_86d0._M_p != &local_86c0) {
    operator_delete(local_86d0._M_p,local_86c0._M_allocated_capacity + 1);
  }
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Serial_Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface ){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base)||
       !dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<": incompatible types. Aborting...\n";
        DebugStop();
    }
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    auto *cmesh = myself->Mesh();
    const auto &equationFilter = myself->EquationFilter();
    auto &materialIds = myself->MaterialIds();
    
    auto &stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto &rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
    if(!cmesh){
        LOGPZ_ERROR(logger,"Serial_Assemble called without mesh")
        DebugStop();
    }
#ifdef PZ_LOG
    if(dynamic_cast<TPZSubCompMesh * >(cmesh))
    {
        std::stringstream sout;
        sout << "AllEig = {};";
        LOGPZ_DEBUG(loggerelmat,sout.str())
        
    }
#endif
#ifdef PZDEBUG
    if (ComputeRhs() && rhs.Rows() != equationFilter.NActiveEquations()) {
        DebugStop();
    }
#endif
    
    int64_t iel;
    int64_t nelem = cmesh->NElements();
    TPZElementMatrixT<TVar> ek(cmesh, TPZElementMatrix::EK),ef(cmesh, TPZElementMatrix::EF);
#ifdef PZ_LOG
    bool globalresult = true;
    bool writereadresult = true;
#endif
    TPZTimer calcstiff("Computing the stiffness matrices");
    TPZTimer assemble("Assembling the stiffness matrices");
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    
    int64_t count = 0;
    for(iel=0; iel < nelem; iel++) {
        TPZCompEl *el = elementvec[iel];
        if(!el) continue;
        int matidsize = materialIds.size();
        if(matidsize){
            TPZMaterial * mat = el->Material();
            TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            if (!mat)
            {
                if (!submesh) {
                    continue;
                }
                else if(submesh->NeedsComputing(materialIds) == false) continue;
            }
            else
            {
                int matid = mat->Id();
                if (myself->ShouldCompute(matid) == false) continue;
            }
        }
        
        count++;
        if(!(count%1000))
        {
            std::cout << '*';
            std::cout.flush();
        }
        if(!(count%20000))
        {
            std::cout << "\n";
        }
        calcstiff.start();
        
        el->CalcStiff(ek,ef);
        
        if(guiInterface) if(guiInterface->AmIKilled()){
            return;
        }
        
#ifdef PZ_LOG
        if(dynamic_cast<TPZSubCompMesh * >(cmesh))
        {
            std::stringstream objname;
            objname << "Element" << iel;
            std::string name = objname.str();
            objname << " = ";
            std::stringstream sout;
            ek.fMat.Print(objname.str().c_str(),sout,EMathematicaInput);
            sout << "AppendTo[AllEig,Eigenvalues[" << name << "]];";
            
            LOGPZ_DEBUG(loggerelmat,sout.str())
            /*		  if(iel == 133)
             {
             std::stringstream sout2;
             el->Reference()->Print(sout2);
             el->Print(sout2);
             LOGPZ_DEBUG(logger,sout2.str())
             }
             */
        }
        
#endif
        
#ifdef CHECKCONSISTENCY
        //extern TPZCheckConsistency stiffconsist("ElementStiff");
        stiffconsist.SetOverWrite(true);
        bool result;
        result = stiffconsist.CheckObject(ek.fMat);
        if(!result)
        {
            globalresult = false;
            std::stringstream sout;
            sout << "element " << iel << " computed differently";
            LOGPZ_ERROR(loggerCheck,sout.str())
        }
        
#endif
        
        calcstiff.stop();
        assemble.start();
        
        if(!el->HasDependency()) {
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            //			TPZSFMatrix<TVar> test(stiffness);
            //			TPZFMatrix<TVar> test2(stiffness.Rows(),stiffness.Cols(),0.);
            //			stiffness.Print("before assembly",std::cout,EMathematicaInput);
            stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			stiffness.Print("stiffness after assembly STK = ",std::cout,EMathematicaInput);
            //			rhs.Print("rhs after assembly Rhs = ",std::cout,EMathematicaInput);
            //			test2.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			test -= stiffness;
            //			test.Print("matriz de rigidez diference",std::cout);
            //			test2.Print("matriz de rigidez interface",std::cout);
            
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled())
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                if(gel)
                {
                    TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                    gel->CenterPoint(gel->NSides()-1, center);
                    gel->X(center, xcenter);
                    sout << "Stiffness for computational element index " << el->Index() << std::endl;
                    sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                }
                else {
                    sout << "Stiffness for computational element without associated geometric element\n";
                }
                ek.Print(sout);
                if(ComputeRhs())ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            ek.ApplyConstraints();
            ef.ApplyConstraints();
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled() && ! dynamic_cast<TPZSubCompMesh *>(cmesh))
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                gel->CenterPoint(gel->NSides()-1, center);
                gel->X(center, xcenter);
                sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                ek.Print(sout);
                ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        }
        
        assemble.stop();
    }//fim for iel
    
#ifdef PZ_LOG
    if(loggerCheck.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "The comparaison results are : consistency check " << globalresult << " write read check " << writereadresult;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        stiffness.Print("Matriz de Rigidez: ",sout,EMathematicaInput);
        if(ComputeRhs()) rhs.Print("Right Handside", sout,EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck,sout.str())
    }
    
#endif
    
}